

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O1

CURLcode Curl_altsvc_save(Curl_easy *data,altsvcinfo *altsvc,char *file)

{
  FILE *pFVar1;
  CURLcode CVar2;
  int iVar3;
  Curl_llist_node *n;
  undefined8 *puVar4;
  char *pcVar5;
  char *pcVar6;
  CURLcode CVar7;
  char *pcVar8;
  char *tempstore;
  FILE *out;
  char *local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  char *local_b0;
  ulong local_a8;
  ulong local_a0;
  FILE *local_98;
  char *local_90;
  char *local_88;
  tm stamp;
  char ipv6_unused [16];
  
  tempstore = (char *)0x0;
  CVar7 = CURLE_OK;
  CVar2 = CURLE_OK;
  if (altsvc != (altsvcinfo *)0x0) {
    if (file == (char *)0x0) {
      file = altsvc->filename;
    }
    CVar2 = CVar7;
    if (((file != (char *)0x0) && ((altsvc->flags & 4U) == 0)) && (*file != '\0')) {
      CVar2 = Curl_fopen(data,file,&out,&tempstore);
      if (CVar2 == CURLE_OK) {
        local_d0 = file;
        fputs("# Your alt-svc cache. https://curl.se/docs/alt-svc.html\n# This file was generated by libcurl! Edit at your own risk.\n"
              ,(FILE *)out);
        n = Curl_llist_head(&altsvc->list);
        if (n == (Curl_llist_node *)0x0) {
          CVar2 = CURLE_OK;
        }
        else {
          do {
            puVar4 = (undefined8 *)Curl_node_elem(n);
            n = Curl_node_next(n);
            pFVar1 = out;
            CVar2 = Curl_gmtime(puVar4[4],&stamp);
            if (CVar2 == CURLE_OK) {
              local_98 = pFVar1;
              iVar3 = inet_pton(10,(char *)puVar4[2],ipv6_unused);
              local_88 = "";
              if (iVar3 == 1) {
                local_88 = "[";
              }
              local_90 = "";
              if (iVar3 == 1) {
                local_90 = "]";
              }
              iVar3 = inet_pton(10,(char *)*puVar4,ipv6_unused);
              pcVar5 = "[";
              pcVar8 = "]";
              if (iVar3 != 1) {
                pcVar5 = "";
                pcVar8 = "";
              }
              iVar3 = *(int *)((long)puVar4 + 0xc);
              pcVar6 = "h1";
              if (iVar3 != 8) {
                if (iVar3 == 0x20) {
                  pcVar6 = "h3";
                }
                else if (iVar3 == 0x10) {
                  pcVar6 = "h2";
                }
                else {
                  pcVar6 = "";
                }
              }
              local_a0 = (ulong)*(ushort *)(puVar4 + 1);
              iVar3 = *(int *)((long)puVar4 + 0x1c);
              local_b0 = "h1";
              if (iVar3 != 8) {
                if (iVar3 == 0x20) {
                  local_b0 = "h3";
                }
                else if (iVar3 == 0x10) {
                  local_b0 = "h2";
                }
                else {
                  local_b0 = "";
                }
              }
              local_a8 = (ulong)*(ushort *)(puVar4 + 3);
              local_b8 = (ulong)(uint)stamp.tm_mday;
              local_c0 = (ulong)(uint)stamp.tm_hour;
              local_c8 = (ulong)(uint)stamp.tm_min;
              CVar2 = CURLE_OK;
              curl_mfprintf(local_98,
                            "%s %s%s%s %u %s %s%s%s %u \"%d%02d%02d %02d:%02d:%02d\" %u %u\n",pcVar6
                            ,pcVar5,*puVar4,pcVar8,local_a0,local_b0,local_88,puVar4[2],local_90,
                            local_a8,(ulong)(stamp.tm_year + 0x76c),(ulong)(stamp.tm_mon + 1),
                            local_b8,local_c0,local_c8,(ulong)(uint)stamp.tm_sec,
                            (ulong)(*(byte *)((long)puVar4 + 0x4c) & 1),(ulong)*(uint *)(puVar4 + 9)
                           );
            }
          } while ((CVar2 == CURLE_OK) && (n != (Curl_llist_node *)0x0));
        }
        fclose((FILE *)out);
        if (tempstore != (char *)0x0 && CVar2 == CURLE_OK) {
          iVar3 = Curl_rename(tempstore,local_d0);
          CVar2 = CURLE_WRITE_ERROR;
          if (iVar3 == 0) {
            CVar2 = CURLE_OK;
          }
        }
        if (tempstore != (char *)0x0 && CVar2 != CURLE_OK) {
          unlink(tempstore);
        }
      }
      (*Curl_cfree)(tempstore);
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_altsvc_save(struct Curl_easy *data,
                          struct altsvcinfo *altsvc, const char *file)
{
  CURLcode result = CURLE_OK;
  FILE *out;
  char *tempstore = NULL;

  if(!altsvc)
    /* no cache activated */
    return CURLE_OK;

  /* if not new name is given, use the one we stored from the load */
  if(!file && altsvc->filename)
    file = altsvc->filename;

  if((altsvc->flags & CURLALTSVC_READONLYFILE) || !file || !file[0])
    /* marked as read-only, no file or zero length filename */
    return CURLE_OK;

  result = Curl_fopen(data, file, &out, &tempstore);
  if(!result) {
    struct Curl_llist_node *e;
    struct Curl_llist_node *n;
    fputs("# Your alt-svc cache. https://curl.se/docs/alt-svc.html\n"
          "# This file was generated by libcurl! Edit at your own risk.\n",
          out);
    for(e = Curl_llist_head(&altsvc->list); e; e = n) {
      struct altsvc *as = Curl_node_elem(e);
      n = Curl_node_next(e);
      result = altsvc_out(as, out);
      if(result)
        break;
    }
    fclose(out);
    if(!result && tempstore && Curl_rename(tempstore, file))
      result = CURLE_WRITE_ERROR;

    if(result && tempstore)
      unlink(tempstore);
  }
  free(tempstore);
  return result;
}